

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.hpp
# Opt level: O0

void __thiscall
bredis::single_command_t::
single_command_t<char_const(&)[5],char_const(&)[4],char_const(&)[7],char_const(&)[1],char_const(&)[7],char_const(&)[1],void>
          (single_command_t *this,char (*args) [5],char (*args_1) [4],char (*args_2) [7],
          char (*args_3) [1],char (*args_4) [7],char (*args_5) [1])

{
  initializer_list<boost::basic_string_ref<char,_std::char_traits<char>_>_> __l;
  allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_> local_a9;
  basic_string_ref<char,_std::char_traits<char>_> local_a8;
  basic_string_ref<char,_std::char_traits<char>_> local_98;
  basic_string_ref<char,_std::char_traits<char>_> local_88;
  basic_string_ref<char,_std::char_traits<char>_> local_78;
  basic_string_ref<char,_std::char_traits<char>_> local_68;
  basic_string_ref<char,_std::char_traits<char>_> local_58;
  basic_string_ref<char,_std::char_traits<char>_> *local_48;
  size_type local_40;
  char (*local_38) [7];
  char (*args_local_4) [7];
  char (*args_local_3) [1];
  char (*args_local_2) [7];
  char (*args_local_1) [4];
  char (*args_local) [5];
  single_command_t *this_local;
  
  local_38 = args_4;
  args_local_4 = (char (*) [7])args_3;
  args_local_3 = (char (*) [1])args_2;
  args_local_2 = (char (*) [7])args_1;
  args_local_1 = (char (*) [4])args;
  args_local = (char (*) [5])this;
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_a8,*args);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_98,*args_local_2);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_88,*args_local_3);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_78,*args_local_4);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_68,*local_38);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_58,*args_5);
  local_40 = 6;
  local_48 = &local_a8;
  std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>::allocator(&local_a9);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::vector(&this->arguments,__l,&local_a9);
  std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>::~allocator(&local_a9);
  return;
}

Assistant:

single_command_t(Args &&... args) : arguments{std::forward<Args>(args)...} {
        static_assert(sizeof...(Args) >= 1, "Empty command is not allowed");
    }